

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isTexCompareResultValid
               (Texture2DView *texture,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,float cmpReference,float result)

{
  int *piVar1;
  Vec2 *coord_00;
  Vec2 *prec_00;
  TexComparePrecision *pTVar2;
  bool bVar3;
  int iVar4;
  FilterMode FVar5;
  ConstPixelBufferAccess *pCVar6;
  ConstPixelBufferAccess *level1;
  float fVar7;
  int local_7c;
  int level_1;
  int maxLevel_1;
  int minLevel_1;
  float local_68;
  float local_64;
  float maxF;
  float minF;
  int level;
  int maxLevel;
  int minLevel;
  int maxTexLevel;
  int minTexLevel;
  bool isLinearMipmap;
  bool isNearestMipmap;
  bool canBeMinified;
  bool canBeMagnified;
  float maxLod;
  float minLod;
  float result_local;
  float cmpReference_local;
  Vec2 *lodBounds_local;
  Vec2 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  Texture2DView *texture_local;
  
  maxLod = result;
  minLod = cmpReference;
  _result_local = lodBounds;
  lodBounds_local = coord;
  coord_local = (Vec2 *)prec;
  prec_local = (TexComparePrecision *)sampler;
  sampler_local = (Sampler *)texture;
  _isLinearMipmap = Vector<float,_2>::x(lodBounds);
  minTexLevel = (int)Vector<float,_2>::y(_result_local);
  maxTexLevel._3_1_ = _isLinearMipmap <= (float)(prec_local->uvwBits).m_data[2];
  piVar1 = (prec_local->uvwBits).m_data + 2;
  maxTexLevel._2_1_ = (float)*piVar1 <= (float)minTexLevel && (float)minTexLevel != (float)*piVar1;
  if ((bool)maxTexLevel._3_1_) {
    pCVar6 = Texture2DView::getLevel((Texture2DView *)sampler_local,0);
    bVar3 = isLevelCompareResultValid
                      (pCVar6,(Sampler *)prec_local,(prec_local->uvwBits).m_data[1],
                       (TexComparePrecision *)coord_local,lodBounds_local,0,minLod,maxLod);
    if (bVar3) {
      return true;
    }
  }
  if ((maxTexLevel._2_1_ & 1) != 0) {
    maxTexLevel._1_1_ = TexVerifierUtil::isNearestMipmapFilter((prec_local->uvwBits).m_data[0]);
    maxTexLevel._0_1_ = TexVerifierUtil::isLinearMipmapFilter((prec_local->uvwBits).m_data[0]);
    minLevel = 0;
    iVar4 = Texture2DView::getNumLevels((Texture2DView *)sampler_local);
    maxLevel = iVar4 + -1;
    if (((byte)maxTexLevel & 1) == 0) {
      if ((maxTexLevel._1_1_ & 1) == 0) {
        pCVar6 = Texture2DView::getLevel((Texture2DView *)sampler_local,0);
        bVar3 = isLevelCompareResultValid
                          (pCVar6,(Sampler *)prec_local,(prec_local->uvwBits).m_data[0],
                           (TexComparePrecision *)coord_local,lodBounds_local,0,minLod,maxLod);
        if (bVar3) {
          return true;
        }
      }
      else {
        fVar7 = ::deFloatCeil(_isLinearMipmap + 0.5);
        local_7c = de::clamp<int>((int)fVar7 + -1,0,maxLevel);
        fVar7 = ::deFloatFloor((float)minTexLevel + 0.5);
        iVar4 = de::clamp<int>((int)fVar7,0,maxLevel);
        for (; local_7c <= iVar4; local_7c = local_7c + 1) {
          pCVar6 = Texture2DView::getLevel((Texture2DView *)sampler_local,local_7c);
          pTVar2 = prec_local;
          FVar5 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
          bVar3 = isLevelCompareResultValid
                            (pCVar6,(Sampler *)pTVar2,FVar5,(TexComparePrecision *)coord_local,
                             lodBounds_local,0,minLod,maxLod);
          if (bVar3) {
            return true;
          }
        }
      }
    }
    else {
      fVar7 = ::deFloatFloor(_isLinearMipmap);
      level = de::clamp<int>((int)fVar7,0,maxLevel + -1);
      fVar7 = ::deFloatFloor((float)minTexLevel);
      minF = (float)de::clamp<int>((int)fVar7,0,maxLevel + -1);
      for (maxF = (float)level; (int)maxF <= (int)minF; maxF = (float)((int)maxF + 1)) {
        local_64 = de::clamp<float>(_isLinearMipmap - (float)(int)maxF,0.0,1.0);
        local_68 = de::clamp<float>((float)minTexLevel - (float)(int)maxF,0.0,1.0);
        pCVar6 = Texture2DView::getLevel((Texture2DView *)sampler_local,(int)maxF);
        level1 = Texture2DView::getLevel((Texture2DView *)sampler_local,(int)maxF + 1);
        pTVar2 = prec_local;
        FVar5 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
        prec_00 = coord_local;
        coord_00 = lodBounds_local;
        Vector<float,_2>::Vector((Vector<float,_2> *)&maxLevel_1,local_64,local_68);
        bVar3 = isMipmapLinearCompareResultValid
                          (pCVar6,level1,(Sampler *)pTVar2,FVar5,(TexComparePrecision *)prec_00,
                           coord_00,0,(Vec2 *)&maxLevel_1,minLod,maxLod);
        if (bVar3) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool isTexCompareResultValid (const Texture2DView&			texture,
							  const Sampler&				sampler,
							  const TexComparePrecision&	prec,
							  const Vec2&					coord,
							  const Vec2&					lodBounds,
							  const float					cmpReference,
							  const float					result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, 0, cmpReference, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel < maxTexLevel);

		if (isLinearMipmap)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearCompareResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, Vec2(minF, maxF), cmpReference, result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelCompareResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, cmpReference, result))
					return true;
			}
		}
		else
		{
			if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, 0, cmpReference, result))
				return true;
		}
	}

	return false;
}